

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O0

bool __thiscall
Eigen::RefBase<Eigen::Ref<Eigen::Matrix<float,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>>::
construct<Eigen::Matrix<float,_1,_1,0,_1,_1>>
          (RefBase<Eigen::Ref<Eigen::Matrix<float,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>>
           *this,Matrix<float,__1,__1,_0,__1,__1> *expr)

{
  Index rows_00;
  Index cols_00;
  Index IVar1;
  Index rows_01;
  Index cols_01;
  Scalar *dataPtr;
  Index local_98;
  long local_90;
  bool outer_valid;
  bool inner_valid;
  Index outer_stride;
  Index inner_stride;
  bool col_vector;
  bool row_vector;
  Index expr_outer_actual;
  Index expr_inner_actual;
  bool swap_stride;
  bool storage_differs;
  bool expr_row_major;
  bool row_major;
  bool transpose;
  Index cols;
  Index rows;
  Matrix<float,__1,__1,_0,__1,__1> *expr_local;
  RefBase<Eigen::Ref<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  *this_local;
  
  rows_00 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                      (&expr->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
  cols_00 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&expr->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
  IVar1 = Matrix<float,_-1,_-1,_0,_-1,_-1>::innerStride(expr);
  local_90 = RefBase<Eigen::Ref<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>
             ::resolveInnerStride(IVar1);
  IVar1 = Matrix<float,_-1,_-1,_0,_-1,_-1>::outerStride(expr);
  rows_01 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                      (&expr->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
  cols_01 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&expr->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
  local_98 = RefBase<Eigen::Ref<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>
             ::resolveOuterStride(local_90,IVar1,rows_01,cols_01,false,false);
  if (rows_00 == 1) {
    local_90 = 1;
  }
  if (cols_00 == 1) {
    local_98 = rows_00 * local_90;
  }
  IVar1 = RefBase<Eigen::Ref<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>
          ::resolveInnerStride(0);
  if (IVar1 == local_90) {
    dataPtr = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::data
                        (&expr->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
    MapBase<Eigen::Ref<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
    ::MapBase((MapBase<Eigen::Ref<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               *)this,dataPtr,rows_00,cols_00);
    Stride<-1,_0>::Stride((Stride<_1,_0> *)(this + 0x18),local_98,0);
  }
  return IVar1 == local_90;
}

Assistant:

EIGEN_DEVICE_FUNC bool construct(Expression& expr)
  {
    // Check matrix sizes.  If this is a compile-time vector, we do allow
    // implicitly transposing.
    EIGEN_STATIC_ASSERT(
      EIGEN_PREDICATE_SAME_MATRIX_SIZE(PlainObjectType, Expression)
      // If it is a vector, the transpose sizes might match.
      || ( PlainObjectType::IsVectorAtCompileTime
            && ((int(PlainObjectType::RowsAtCompileTime)==Eigen::Dynamic
              || int(Expression::ColsAtCompileTime)==Eigen::Dynamic
              || int(PlainObjectType::RowsAtCompileTime)==int(Expression::ColsAtCompileTime))
            &&  (int(PlainObjectType::ColsAtCompileTime)==Eigen::Dynamic
              || int(Expression::RowsAtCompileTime)==Eigen::Dynamic
              || int(PlainObjectType::ColsAtCompileTime)==int(Expression::RowsAtCompileTime)))),
      YOU_MIXED_MATRICES_OF_DIFFERENT_SIZES
    )

    // Determine runtime rows and columns.
    Index rows = expr.rows();
    Index cols = expr.cols();
    if(PlainObjectType::RowsAtCompileTime==1)
    {
      eigen_assert(expr.rows()==1 || expr.cols()==1);
      rows = 1;
      cols = expr.size();
    }
    else if(PlainObjectType::ColsAtCompileTime==1)
    {
      eigen_assert(expr.rows()==1 || expr.cols()==1);
      rows = expr.size();
      cols = 1;
    }
    // Verify that the sizes are valid.
    eigen_assert(
      (PlainObjectType::RowsAtCompileTime == Dynamic) || (PlainObjectType::RowsAtCompileTime == rows));
    eigen_assert(
      (PlainObjectType::ColsAtCompileTime == Dynamic) || (PlainObjectType::ColsAtCompileTime == cols));


    // If this is a vector, we might be transposing, which means that stride should swap.
    const bool transpose = PlainObjectType::IsVectorAtCompileTime && (rows != expr.rows());
    // If the storage format differs, we also need to swap the stride.
    const bool row_major = ((PlainObjectType::Flags)&RowMajorBit) != 0;
    const bool expr_row_major = (Expression::Flags&RowMajorBit) != 0;
    const bool storage_differs =  (row_major != expr_row_major);

    const bool swap_stride = (transpose != storage_differs);

    // Determine expr's actual strides, resolving any defaults if zero.
    const Index expr_inner_actual = resolveInnerStride(expr.innerStride());
    const Index expr_outer_actual = resolveOuterStride(expr_inner_actual,
                                                       expr.outerStride(),
                                                       expr.rows(),
                                                       expr.cols(),
                                                       Expression::IsVectorAtCompileTime != 0,
                                                       expr_row_major);

    // If this is a column-major row vector or row-major column vector, the inner-stride
    // is arbitrary, so set it to either the compile-time inner stride or 1.
    const bool row_vector = (rows == 1);
    const bool col_vector = (cols == 1);
    const Index inner_stride =
        ( (!row_major && row_vector) || (row_major && col_vector) ) ?
            ( StrideType::InnerStrideAtCompileTime > 0 ? Index(StrideType::InnerStrideAtCompileTime) : 1)
            : swap_stride ? expr_outer_actual : expr_inner_actual;

    // If this is a column-major column vector or row-major row vector, the outer-stride
    // is arbitrary, so set it to either the compile-time outer stride or vector size.
    const Index outer_stride =
      ( (!row_major && col_vector) || (row_major && row_vector) ) ?
          ( StrideType::OuterStrideAtCompileTime > 0 ? Index(StrideType::OuterStrideAtCompileTime) : rows * cols * inner_stride)
          : swap_stride ? expr_inner_actual : expr_outer_actual;

    // Check if given inner/outer strides are compatible with compile-time strides.
    const bool inner_valid = (StrideType::InnerStrideAtCompileTime == Dynamic)
        || (resolveInnerStride(Index(StrideType::InnerStrideAtCompileTime)) == inner_stride);
    if (!inner_valid) {
      return false;
    }

    const bool outer_valid = (StrideType::OuterStrideAtCompileTime == Dynamic)
        || (resolveOuterStride(
              inner_stride,
              Index(StrideType::OuterStrideAtCompileTime),
              rows, cols, PlainObjectType::IsVectorAtCompileTime != 0,
              row_major)
            == outer_stride);
    if (!outer_valid) {
      return false;
    }

    ::new (static_cast<Base*>(this)) Base(expr.data(), rows, cols);
    ::new (&m_stride) StrideBase(
      (StrideType::OuterStrideAtCompileTime == 0) ? 0 : outer_stride,
      (StrideType::InnerStrideAtCompileTime == 0) ? 0 : inner_stride );
    return true;
  }